

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::a_type_abi_cxx11_(string *__return_storage_ptr__,t_st_generator *this,t_type *type)

{
  t_st_generator *this_00;
  string prefix;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48 [2];
  
  this_00 = (t_st_generator *)local_88;
  local_68._0_8_ = local_68 + 0x10;
  local_68._8_8_ = (_Base_ptr)0x0;
  local_68[0x10] = 0;
  type_name_abi_cxx11_((string *)local_88,this,type);
  is_vowel(this_00,*(char *)local_88._0_8_);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::assign(local_88 + 0x20);
  type_name_abi_cxx11_((string *)local_48,this,type);
  t_generator::capitalize((string *)local_88,(t_generator *)this,(string *)local_48);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_88 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_48[0]._M_local_buf);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::a_type(t_type* type) {
  string prefix;

  if (is_vowel(type_name(type)[0]))
    prefix = "an";
  else
    prefix = "a";

  return prefix + capitalize(type_name(type));
}